

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmath.hpp
# Opt level: O0

size_t anon_unknown.dwarf_13153d::primeCountApprox(uint64_t start,uint64_t stop)

{
  long lVar1;
  ulong in_RSI;
  ulong in_RDI;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double pix;
  double div;
  double logx;
  double x;
  undefined8 local_8;
  
  if (in_RSI < in_RDI) {
    local_8 = 0;
  }
  else if (in_RSI < 0xb) {
    local_8 = 4;
  }
  else {
    auVar3._8_4_ = (int)(in_RSI >> 0x20);
    auVar3._0_8_ = in_RSI;
    auVar3._12_4_ = 0x45300000;
    dVar2 = log((auVar3._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)in_RSI) - 4503599627370496.0));
    lVar1 = in_RSI - in_RDI;
    auVar4._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar4._0_8_ = lVar1;
    auVar4._12_4_ = 0x45300000;
    dVar2 = ((auVar4._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) / (dVar2 + -1.1) + 5.0;
    local_8 = (ulong)dVar2;
    local_8 = local_8 | (long)(dVar2 - 9.223372036854776e+18) & (long)local_8 >> 0x3f;
  }
  return local_8;
}

Assistant:

inline std::size_t primeCountApprox(uint64_t start, uint64_t stop)
{
  if (start > stop)
    return 0;
  if (stop <= 10)
    return 4;

  // pi(x) <= x / (log(x) - 1.1) + 5, for x >= 4
  double x = (double) stop;
  double logx = std::log(x);
  double div = logx - 1.1;
  double pix = (stop - start) / div + 5;

  return (std::size_t) pix;
}